

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psarrst.c
# Opt level: O2

void * cf2_arrstack_getPointer(CF2_ArrStack arrstack,size_t idx)

{
  int *piVar1;
  
  if (arrstack->count <= idx) {
    piVar1 = arrstack->error;
    if ((piVar1 != (int *)0x0) && (*piVar1 == 0)) {
      *piVar1 = 0x82;
    }
    idx = 0;
  }
  return (void *)(idx * arrstack->sizeItem + (long)arrstack->ptr);
}

Assistant:

FT_LOCAL_DEF( void* )
  cf2_arrstack_getPointer( const CF2_ArrStack  arrstack,
                           size_t              idx )
  {
    void*  newPtr;


    FT_ASSERT( arrstack );

    if ( idx >= arrstack->count )
    {
      /* overflow */
      CF2_SET_ERROR( arrstack->error, Stack_Overflow );
      idx = 0;    /* choose safe default */
    }

    newPtr = (FT_Byte*)arrstack->ptr + idx * arrstack->sizeItem;

    return newPtr;
  }